

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.cpp
# Opt level: O2

int __thiscall CDataFileWriter::Finish(CDataFileWriter *this)

{
  long lVar1;
  ulong uVar2;
  int i;
  int Count;
  int iVar3;
  int iVar4;
  int i_1;
  long lVar5;
  long in_FS_OFFSET;
  CDatafileItemType Info;
  undefined8 local_5c;
  int local_54;
  int local_50;
  int local_4c;
  uint local_48;
  uint local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_File == (IOHANDLE)0x0) {
    iVar3 = 0;
  }
  else {
    local_48 = this->m_NumItems;
    lVar1 = 0;
    uVar2 = 0;
    if (0 < (int)local_48) {
      uVar2 = (ulong)local_48;
    }
    local_40 = 0;
    for (; uVar2 * 0x20 != lVar1; lVar1 = lVar1 + 0x20) {
      local_40 = local_40 + *(int *)((long)&this->m_pItems->m_Size + lVar1) + 8;
    }
    local_44 = this->m_NumDatas;
    lVar1 = 0;
    uVar2 = 0;
    if (0 < (int)local_44) {
      uVar2 = (ulong)local_44;
    }
    local_3c = 0;
    for (; uVar2 * 0x10 != lVar1; lVar1 = lVar1 + 0x10) {
      local_3c = local_3c + *(int *)((long)&this->m_pDatas->m_CompressedSize + lVar1);
    }
    local_4c = this->m_NumItemTypes;
    local_50 = local_40 + local_48 * 4 + local_44 * 8;
    local_5c = 0x441544144;
    local_54 = local_3c + 0x14 + local_50 + local_4c * 0xc;
    local_50 = local_4c * 0xc + 0x14 + local_50;
    io_write(this->m_File,&local_5c,0x24);
    lVar5 = 0;
    iVar3 = 0;
    for (lVar1 = 0; lVar1 != 0xffff; lVar1 = lVar1 + 1) {
      iVar4 = *(int *)((long)&this->m_pItemTypes->m_Num + lVar5);
      if (iVar4 != 0) {
        Info.m_Type = (int)lVar1;
        Info.m_Start = iVar3;
        Info.m_Num = iVar4;
        io_write(this->m_File,&Info,0xc);
        iVar3 = iVar3 + *(int *)((long)&this->m_pItemTypes->m_Num + lVar5);
      }
      lVar5 = lVar5 + 0xc;
    }
    iVar3 = 0;
    for (lVar1 = 0; lVar1 != 0xffff; lVar1 = lVar1 + 1) {
      if (this->m_pItemTypes[lVar1].m_Num != 0) {
        for (iVar4 = this->m_pItemTypes[lVar1].m_First; iVar4 != -1;
            iVar4 = this->m_pItems[iVar4].m_Next) {
          Info.m_Type = iVar3;
          io_write(this->m_File,&Info,4);
          iVar3 = iVar3 + this->m_pItems[iVar4].m_Size + 8;
        }
      }
    }
    lVar1 = 4;
    iVar3 = 0;
    for (lVar5 = 0; uVar2 = (ulong)this->m_NumDatas, lVar5 < (long)uVar2; lVar5 = lVar5 + 1) {
      Info.m_Type = iVar3;
      io_write(this->m_File,&Info,4);
      iVar3 = iVar3 + *(int *)((long)&this->m_pDatas->m_UncompressedSize + lVar1);
      lVar1 = lVar1 + 0x10;
    }
    lVar5 = 0;
    for (lVar1 = 0; lVar1 < (int)uVar2; lVar1 = lVar1 + 1) {
      Info.m_Type = *(int *)((long)&this->m_pDatas->m_UncompressedSize + lVar5);
      io_write(this->m_File,&Info,4);
      uVar2 = (ulong)(uint)this->m_NumDatas;
      lVar5 = lVar5 + 0x10;
    }
    for (lVar1 = 0; lVar1 != 0xffff; lVar1 = lVar1 + 1) {
      if (this->m_pItemTypes[lVar1].m_Num != 0) {
        for (iVar3 = this->m_pItemTypes[lVar1].m_First; iVar3 != -1;
            iVar3 = this->m_pItems[iVar3].m_Next) {
          Info.m_Type = this->m_pItems[iVar3].m_ID | (int)lVar1 << 0x10;
          Info.m_Start = this->m_pItems[iVar3].m_Size;
          io_write(this->m_File,&Info,8);
          io_write(this->m_File,this->m_pItems[iVar3].m_pData,this->m_pItems[iVar3].m_Size);
        }
      }
    }
    lVar1 = 8;
    for (lVar5 = 0; lVar5 < this->m_NumDatas; lVar5 = lVar5 + 1) {
      io_write(this->m_File,*(void **)((long)&this->m_pDatas->m_UncompressedSize + lVar1),
               *(uint *)((long)this->m_pDatas + lVar1 + -4));
      lVar1 = lVar1 + 0x10;
    }
    lVar1 = 0x18;
    for (lVar5 = 0; lVar5 < this->m_NumItems; lVar5 = lVar5 + 1) {
      mem_free(*(void **)((long)&this->m_pItems->m_Type + lVar1));
      lVar1 = lVar1 + 0x20;
    }
    lVar1 = 8;
    for (lVar5 = 0; lVar5 < this->m_NumDatas; lVar5 = lVar5 + 1) {
      mem_free(*(void **)((long)&this->m_pDatas->m_UncompressedSize + lVar1));
      lVar1 = lVar1 + 0x10;
    }
    io_close(this->m_File);
    this->m_File = (IOHANDLE)0x0;
    iVar3 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int CDataFileWriter::Finish()
{
	if(!m_File) return 0;

	int ItemSize = 0;
	int TypesSize, HeaderSize, OffsetSize, FileSize, SwapSize;
	int DataSize = 0;
	CDatafileHeader Header;

	// we should now write this file!
	if(DEBUG)
		dbg_msg("datafile", "writing");

	// calculate sizes
	for(int i = 0; i < m_NumItems; i++)
	{
		if(DEBUG)
			dbg_msg("datafile", "item=%d size=%d (%d)", i, m_pItems[i].m_Size, (int)(m_pItems[i].m_Size+sizeof(CDatafileItem)));
		ItemSize += m_pItems[i].m_Size + sizeof(CDatafileItem);
	}


	for(int i = 0; i < m_NumDatas; i++)
		DataSize += m_pDatas[i].m_CompressedSize;

	// calculate the complete size
	TypesSize = m_NumItemTypes*sizeof(CDatafileItemType);
	HeaderSize = sizeof(CDatafileHeader);
	OffsetSize = (m_NumItems + m_NumDatas + m_NumDatas) * sizeof(int); // ItemOffsets, DataOffsets, DataUncompressedSizes
	FileSize = HeaderSize + TypesSize + OffsetSize + ItemSize + DataSize;
	SwapSize = FileSize - DataSize;

	(void)SwapSize;

	if(DEBUG)
		dbg_msg("datafile", "num_m_aItemTypes=%d TypesSize=%d m_aItemsize=%d DataSize=%d", m_NumItemTypes, TypesSize, ItemSize, DataSize);

	// construct Header
	{
		Header.m_aID[0] = 'D';
		Header.m_aID[1] = 'A';
		Header.m_aID[2] = 'T';
		Header.m_aID[3] = 'A';
		Header.m_Version = 4;
		Header.m_Size = FileSize - 16;
		Header.m_Swaplen = SwapSize - 16;
		Header.m_NumItemTypes = m_NumItemTypes;
		Header.m_NumItems = m_NumItems;
		Header.m_NumRawData = m_NumDatas;
		Header.m_ItemSize = ItemSize;
		Header.m_DataSize = DataSize;

		// write Header
		if(DEBUG)
			dbg_msg("datafile", "HeaderSize=%d", (int)sizeof(Header));
#if defined(CONF_ARCH_ENDIAN_BIG)
		swap_endian(&Header, sizeof(int), sizeof(Header)/sizeof(int));
#endif
		io_write(m_File, &Header, sizeof(Header));
	}

	// write types
	for(int i = 0, Count = 0; i < 0xffff; i++)
	{
		if(m_pItemTypes[i].m_Num)
		{
			// write info
			CDatafileItemType Info;
			Info.m_Type = i;
			Info.m_Start = Count;
			Info.m_Num = m_pItemTypes[i].m_Num;
			if(DEBUG)
				dbg_msg("datafile", "writing type=%x start=%d num=%d", Info.m_Type, Info.m_Start, Info.m_Num);
#if defined(CONF_ARCH_ENDIAN_BIG)
			swap_endian(&Info, sizeof(int), sizeof(CDatafileItemType)/sizeof(int));
#endif
			io_write(m_File, &Info, sizeof(Info));
			Count += m_pItemTypes[i].m_Num;
		}
	}

	// write item offsets
	for(int i = 0, Offset = 0; i < 0xffff; i++)
	{
		if(m_pItemTypes[i].m_Num)
		{
			// write all m_pItems in of this type
			int k = m_pItemTypes[i].m_First;
			while(k != -1)
			{
				if(DEBUG)
					dbg_msg("datafile", "writing item offset num=%d offset=%d", k, Offset);
				int Temp = Offset;
#if defined(CONF_ARCH_ENDIAN_BIG)
				swap_endian(&Temp, sizeof(int), sizeof(Temp)/sizeof(int));
#endif
				io_write(m_File, &Temp, sizeof(Temp));
				Offset += m_pItems[k].m_Size + sizeof(CDatafileItem);

				// next
				k = m_pItems[k].m_Next;
			}
		}
	}

	// write data offsets
	for(int i = 0, Offset = 0; i < m_NumDatas; i++)
	{
		if(DEBUG)
			dbg_msg("datafile", "writing data offset num=%d offset=%d", i, Offset);
		int Temp = Offset;
#if defined(CONF_ARCH_ENDIAN_BIG)
		swap_endian(&Temp, sizeof(int), sizeof(Temp)/sizeof(int));
#endif
		io_write(m_File, &Temp, sizeof(Temp));
		Offset += m_pDatas[i].m_CompressedSize;
	}

	// write data uncompressed sizes
	for(int i = 0; i < m_NumDatas; i++)
	{
		if(DEBUG)
			dbg_msg("datafile", "writing data uncompressed size num=%d size=%d", i, m_pDatas[i].m_UncompressedSize);
		int UncompressedSize = m_pDatas[i].m_UncompressedSize;
#if defined(CONF_ARCH_ENDIAN_BIG)
		swap_endian(&UncompressedSize, sizeof(int), sizeof(UncompressedSize)/sizeof(int));
#endif
		io_write(m_File, &UncompressedSize, sizeof(UncompressedSize));
	}

	// write m_pItems
	for(int i = 0; i < 0xffff; i++)
	{
		if(m_pItemTypes[i].m_Num)
		{
			// write all m_pItems in of this type
			int k = m_pItemTypes[i].m_First;
			while(k != -1)
			{
				CDatafileItem Item;
				Item.m_TypeAndID = (i<<16)|m_pItems[k].m_ID;
				Item.m_Size = m_pItems[k].m_Size;
				if(DEBUG)
					dbg_msg("datafile", "writing item type=%x idx=%d id=%d size=%d", i, k, m_pItems[k].m_ID, m_pItems[k].m_Size);

#if defined(CONF_ARCH_ENDIAN_BIG)
				swap_endian(&Item, sizeof(int), sizeof(Item)/sizeof(int));
				swap_endian(m_pItems[k].m_pData, sizeof(int), m_pItems[k].m_Size/sizeof(int));
#endif
				io_write(m_File, &Item, sizeof(Item));
				io_write(m_File, m_pItems[k].m_pData, m_pItems[k].m_Size);

				// next
				k = m_pItems[k].m_Next;
			}
		}
	}

	// write data
	for(int i = 0; i < m_NumDatas; i++)
	{
		if(DEBUG)
			dbg_msg("datafile", "writing data id=%d size=%d", i, m_pDatas[i].m_CompressedSize);
		io_write(m_File, m_pDatas[i].m_pCompressedData, m_pDatas[i].m_CompressedSize);
	}

	// free data
	for(int i = 0; i < m_NumItems; i++)
		mem_free(m_pItems[i].m_pData);
	for(int i = 0; i < m_NumDatas; ++i)
		mem_free(m_pDatas[i].m_pCompressedData);

	io_close(m_File);
	m_File = 0;

	if(DEBUG)
		dbg_msg("datafile", "done");
	return 1;
}